

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

void __thiscall
amrex::Geometry::periodicShift
          (Geometry *this,Box *target,Box *src,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *out)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *in_RDX;
  long in_RDI;
  Box *this_00;
  int rk;
  int rj;
  int ri;
  int nkend;
  int nkst;
  int njend;
  int njst;
  int niend;
  int nist;
  Box locsrc;
  value_type *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  IntVect local_6c;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined4 local_40;
  Box local_3c;
  int *local_18;
  
  local_18 = in_RDX;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_3c.smallend.vect._0_8_ = *(undefined8 *)local_18;
  local_3c.smallend.vect[2] = local_18[2];
  local_3c.bigend.vect[0] = local_18[3];
  local_3c.bigend.vect._4_8_ = *(undefined8 *)(local_18 + 4);
  local_3c.btype.itype = local_18[6];
  local_40 = 0xffffffff;
  local_44 = 1;
  local_48 = -1;
  local_4c = 1;
  local_50 = -1;
  local_54 = 1;
  for (local_58 = -1; iVar3 = local_58, local_58 <= local_44; local_58 = local_58 + 1) {
    if ((local_58 == 0) || ((*(byte *)(in_RDI + 0x51) & 1) != 0)) {
      if ((local_58 != 0) && ((*(byte *)(in_RDI + 0x51) & 1) != 0)) {
        iVar2 = Box::length((Box *)(in_RDI + 0xac),0);
        Box::shift(&local_3c,0,iVar3 * iVar2);
      }
      for (local_5c = local_48; iVar3 = local_5c, local_5c <= local_4c; local_5c = local_5c + 1) {
        if ((local_5c == 0) || ((*(byte *)(in_RDI + 0x52) & 1) != 0)) {
          if ((local_5c != 0) && ((*(byte *)(in_RDI + 0x52) & 1) != 0)) {
            iVar2 = Box::length((Box *)(in_RDI + 0xac),1);
            Box::shift(&local_3c,1,iVar3 * iVar2);
          }
          for (local_60 = local_50; iVar3 = local_60, local_60 <= local_54; local_60 = local_60 + 1)
          {
            if ((local_60 == 0) || ((*(byte *)(in_RDI + 0x53) & 1) != 0)) {
              if ((local_60 != 0) && ((*(byte *)(in_RDI + 0x53) & 1) != 0)) {
                iVar2 = Box::length((Box *)(in_RDI + 0xac),2);
                Box::shift(&local_3c,2,iVar3 * iVar2);
              }
              if (((local_58 != 0) || (local_5c != 0)) || (local_60 != 0)) {
                bVar1 = Box::intersects((Box *)CONCAT44(in_stack_ffffffffffffff64,
                                                        in_stack_ffffffffffffff60),
                                        (Box *)CONCAT44(in_stack_ffffffffffffff5c,
                                                        in_stack_ffffffffffffff58));
                iVar3 = local_58;
                if (bVar1) {
                  this_00 = (Box *)(in_RDI + 0xac);
                  iVar2 = Box::length(this_00,0);
                  in_stack_ffffffffffffff60 = iVar3 * iVar2;
                  in_stack_ffffffffffffff58 = local_5c;
                  iVar3 = Box::length(this_00,1);
                  in_stack_ffffffffffffff64 = in_stack_ffffffffffffff58 * iVar3;
                  in_stack_ffffffffffffff5c = local_60;
                  iVar3 = Box::length(this_00,2);
                  IntVect::IntVect(&local_6c,in_stack_ffffffffffffff60,in_stack_ffffffffffffff64,
                                   in_stack_ffffffffffffff5c * iVar3);
                  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::push_back
                            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             in_stack_ffffffffffffff38);
                }
                if ((local_60 != 0) && ((*(byte *)(in_RDI + 0x53) & 1) != 0)) {
                  iVar3 = -local_60;
                  iVar2 = Box::length((Box *)(in_RDI + 0xac),2);
                  Box::shift(&local_3c,2,iVar3 * iVar2);
                }
              }
            }
          }
          if ((local_5c != 0) && ((*(byte *)(in_RDI + 0x52) & 1) != 0)) {
            in_stack_ffffffffffffff44 = -local_5c;
            iVar3 = Box::length((Box *)(in_RDI + 0xac),1);
            Box::shift(&local_3c,1,in_stack_ffffffffffffff44 * iVar3);
          }
        }
      }
      if ((local_58 != 0) && ((*(byte *)(in_RDI + 0x51) & 1) != 0)) {
        in_stack_ffffffffffffff40 = -local_58;
        iVar3 = Box::length((Box *)(in_RDI + 0xac),0);
        Box::shift(&local_3c,0,in_stack_ffffffffffffff40 * iVar3);
      }
    }
  }
  return;
}

Assistant:

void
Geometry::periodicShift (const Box&      target,
                         const Box&      src,
                         Vector<IntVect>& out) const noexcept
{
    out.resize(0);

    Box locsrc(src);

    int nist  = -1;
    int niend =  1;
#if (AMREX_SPACEDIM > 1)
    int njst  = -1;
    int njend =  1;
#else
    int njst  = 0;
    int njend = 0;
#endif
#if (AMREX_SPACEDIM > 2)
    int nkst  = -1;
    int nkend =  1;
#else
    int nkst  = 0;
    int nkend = 0;
#endif

    int ri,rj,rk;
    for (ri = nist; ri <= niend; ri++)
    {
        if (ri != 0 && !is_periodic[0])
            continue;
        if (ri != 0 && is_periodic[0])
            locsrc.shift(0,ri*domain.length(0));

        for (rj = njst; rj <= njend; rj++)
        {
            if (rj != 0
#if (AMREX_SPACEDIM > 1)
                && !is_periodic[1]
#endif
                )
            {
                continue;
            }
            if (rj != 0
#if (AMREX_SPACEDIM > 1)
                && is_periodic[1]
#endif
                )
            {
                locsrc.shift(1,rj*domain.length(1));
            }

            for (rk = nkst; rk <= nkend; rk++)
            {
                if (rk!=0
#if (AMREX_SPACEDIM == 3)
                    && !is_periodic[2]
#endif
                    )
                {
                    continue;
                }
                if (rk!=0
#if (AMREX_SPACEDIM == 3)
                    && is_periodic[2]
#endif
                    )
                {
                    locsrc.shift(2,rk*domain.length(2));
                }

                if (ri == 0 && rj == 0 && rk == 0)
                    continue;
                //
                // If losrc intersects target, then add to "out".
                //
                if (target.intersects(locsrc))
                {
                    out.push_back(IntVect(AMREX_D_DECL(ri*domain.length(0),
                                                 rj*domain.length(1),
                                                 rk*domain.length(2))));
                }
                if (rk != 0
#if (AMREX_SPACEDIM == 3)
                    && is_periodic[2]
#endif
                    )
                {
                    locsrc.shift(2,-rk*domain.length(2));
                }
            }
            if (rj != 0
#if (AMREX_SPACEDIM > 1)
                && is_periodic[1]
#endif
                )
            {
                locsrc.shift(1,-rj*domain.length(1));
            }
        }
        if (ri != 0 && is_periodic[0])
            locsrc.shift(0,-ri*domain.length(0));
    }
}